

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::SamplerTest::SamplerTest
          (SamplerTest *this,TestContext *testContext,char *name,char *description,
          VkImageViewType imageViewType,VkFormat imageFormat,int imageSize,float samplerLod)

{
  allocator<char> local_6e;
  allocator<char> local_6d;
  float local_6c;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  local_6c = samplerLod;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,name,&local_6d);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_68,description,&local_6e);
  tcu::TestCase::TestCase((TestCase *)this,testContext,(char *)local_48[0],(char *)local_68[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d20790;
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d29c60;
  this->m_imageViewType = imageViewType;
  this->m_imageFormat = imageFormat;
  this->m_imageSize = imageSize;
  this->m_samplerLod = local_6c;
  return;
}

Assistant:

SamplerTest::SamplerTest (tcu::TestContext&	testContext,
						  const char*		name,
						  const char*		description,
						  VkImageViewType	imageViewType,
						  VkFormat			imageFormat,
						  int				imageSize,
						  float				samplerLod)
	: vkt::TestCase		(testContext, name, description)
	, m_imageViewType	(imageViewType)
	, m_imageFormat		(imageFormat)
	, m_imageSize		(imageSize)
	, m_samplerLod		(samplerLod)
{
}